

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
          (SmallVectorBase<slang::parsing::Trivia> *this,Trivia *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  size_type sVar3;
  ulong uVar4;
  pointer p;
  undefined8 uVar5;
  pointer pTVar6;
  pointer pTVar7;
  pointer pTVar8;
  long lVar9;
  long lVar10;
  pointer __src;
  ulong uVar11;
  long lVar12;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    uVar5 = *(undefined8 *)((long)&args->field_0 + 8);
    (__src->field_0).rawText.ptr = (args->field_0).rawText.ptr;
    *(undefined8 *)((long)&__src->field_0 + 8) = uVar5;
    sVar3 = this->len;
    this->len = sVar3 + 1;
    return this->data_ + sVar3;
  }
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar11 = this->len + 1;
  uVar4 = this->cap;
  if (uVar11 < uVar4 * 2) {
    uVar11 = uVar4 * 2;
  }
  if (0x7ffffffffffffff - uVar4 < uVar4) {
    uVar11 = 0x7ffffffffffffff;
  }
  lVar12 = (long)__src - (long)this->data_;
  pTVar8 = (pointer)operator_new(uVar11 << 4);
  uVar5 = *(undefined8 *)((long)&args->field_0 + 8);
  *(undefined8 *)((long)pTVar8 + lVar12) = (args->field_0).rawText.ptr;
  ((undefined8 *)((long)pTVar8 + lVar12))[1] = uVar5;
  p = this->data_;
  lVar9 = this->len * 0x10;
  lVar10 = (long)p + (lVar9 - (long)__src);
  pTVar6 = p;
  pTVar7 = pTVar8;
  if (lVar10 == 0) {
    if (this->len != 0) {
      lVar10 = 0;
      do {
        puVar1 = (undefined8 *)((long)&p->field_0 + lVar10);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pTVar8->field_0 + lVar10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        lVar10 = lVar10 + 0x10;
      } while (lVar9 != lVar10);
    }
  }
  else {
    for (; pTVar6 != __src; pTVar6 = pTVar6 + 1) {
      uVar5 = *(undefined8 *)((long)&pTVar6->field_0 + 8);
      (pTVar7->field_0).rawText.ptr = (pTVar6->field_0).rawText.ptr;
      *(undefined8 *)((long)&pTVar7->field_0 + 8) = uVar5;
      pTVar7 = pTVar7 + 1;
    }
    memcpy((void *)((long)pTVar8 + lVar12 + 0x10),__src,(lVar10 - 0x10U & 0xfffffffffffffff0) + 0x10
          );
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar11;
  this->data_ = pTVar8;
  return (reference)((long)pTVar8 + lVar12);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }